

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageLevel.cpp
# Opt level: O3

void __thiscall Imf_3_2::FlatImageLevel::clearChannels(FlatImageLevel *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->_channels)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 2) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 2) + 0x10))();
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
  ::clear(&(this->_channels)._M_t);
  return;
}

Assistant:

void
FlatImageLevel::clearChannels ()
{
    for (ChannelMap::iterator i = _channels.begin (); i != _channels.end ();
         ++i)
        delete i->second;

    _channels.clear ();
}